

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite_huge.c
# Opt level: O0

void Fatal(unqlite *pDb,char *zMsg)

{
  int local_24;
  char *pcStack_20;
  int iLen;
  char *zErr;
  char *zMsg_local;
  unqlite *pDb_local;
  
  zErr = zMsg;
  zMsg_local = (char *)pDb;
  if (pDb == (unqlite *)0x0) {
    if (zMsg != (char *)0x0) {
      puts(zMsg);
    }
  }
  else {
    local_24 = 0;
    unqlite_config(pDb,3,&stack0xffffffffffffffe0,&local_24);
    if (0 < local_24) {
      puts(pcStack_20);
    }
  }
  unqlite_lib_shutdown();
  exit(0);
}

Assistant:

static void Fatal(unqlite *pDb, const char *zMsg)
{
	if (pDb) {
		const char *zErr;
		int iLen = 0; /* Stupid cc warning */

		/* Extract the database error log */
		unqlite_config(pDb, UNQLITE_CONFIG_ERR_LOG, &zErr, &iLen);
		if (iLen > 0) {
			/* Output the DB error log */
			puts(zErr); /* Always null terminated */
		}
	}
	else {
		if (zMsg) {
			puts(zMsg);
		}
	}
	/* Manually shutdown the library */
	unqlite_lib_shutdown();
	/* Exit immediately */
	exit(0);
}